

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix4d * tinyusdz::to_matrix(matrix4d *__return_storage_ptr__,quatd *q)

{
  const_reference x_;
  const_reference y_;
  const_reference z_;
  V *pVVar1;
  double *pdVar2;
  vec<double,_4> local_78;
  undefined1 local_58 [8];
  double3x3 m33;
  quatd *q_local;
  
  m33.z.z = (double)q;
  x_ = ::std::array<double,_3UL>::operator[](&q->imag,0);
  y_ = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)m33.z.z,1);
  z_ = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)m33.z.z,2);
  linalg::vec<double,_4>::vec(&local_78,x_,y_,z_,(double *)((long)m33.z.z + 0x18));
  linalg::qmat<double>((mat<double,_3,_3> *)local_58,&local_78);
  value::matrix4d::matrix4d(__return_storage_ptr__);
  Identity(__return_storage_ptr__);
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,0);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,0);
  __return_storage_ptr__->m[0][0] = *pdVar2;
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,0);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,1);
  __return_storage_ptr__->m[0][1] = *pdVar2;
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,0);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,2);
  __return_storage_ptr__->m[0][2] = *pdVar2;
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,1);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,0);
  __return_storage_ptr__->m[1][0] = *pdVar2;
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,1);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,1);
  __return_storage_ptr__->m[1][1] = *pdVar2;
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,1);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,2);
  __return_storage_ptr__->m[1][2] = *pdVar2;
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,2);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,0);
  __return_storage_ptr__->m[2][0] = *pdVar2;
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,2);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,1);
  __return_storage_ptr__->m[2][1] = *pdVar2;
  pVVar1 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,2);
  pdVar2 = linalg::vec<double,_3>::operator[](pVVar1,2);
  __return_storage_ptr__->m[2][2] = *pdVar2;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d to_matrix(const value::quatd &q) {
  double3x3 m33 =
      linalg::qmat<double>({q.imag[0], q.imag[1], q.imag[2], q.real});

  value::matrix4d m;
  Identity(&m);

  m.m[0][0] = m33[0][0];
  m.m[0][1] = m33[0][1];
  m.m[0][2] = m33[0][2];
  m.m[1][0] = m33[1][0];
  m.m[1][1] = m33[1][1];
  m.m[1][2] = m33[1][2];
  m.m[2][0] = m33[2][0];
  m.m[2][1] = m33[2][1];
  m.m[2][2] = m33[2][2];

  return m;
}